

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

int assert_char_eq(char a,char b,char *testcase,int line)

{
  uint in_ECX;
  undefined8 in_RDX;
  char in_SIL;
  char in_DIL;
  int err;
  
  test_counter = test_counter + 1;
  if ((in_DIL != in_SIL) == 0) {
    printf("ok %d - %s...\n",(ulong)(uint)test_counter,in_RDX);
  }
  else {
    printf("not ok %d - %s...\n",(ulong)(uint)test_counter,in_RDX);
    printf("# Expected %c, but observed %c instead (line %d)\n",(ulong)(uint)(int)in_DIL,
           (ulong)(uint)(int)in_SIL,(ulong)in_ECX);
    global_err = global_err + 1;
  }
  return (uint)(in_DIL != in_SIL);
}

Assistant:

int assert_char_eq(char a, char b, const char *testcase, int line)
{
    test_counter++;
    int err = a!=b;
    if(err) {
        printf("not ok %d - %s...\n", test_counter, testcase);
        printf("# Expected %c, but observed %c instead (line %d)\n", a, b, line);
        global_err++;
    } else
        printf("ok %d - %s...\n", test_counter, testcase);
    return err;
}